

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.cpp
# Opt level: O2

ChClassFactory * chrono::ChClassFactory::GetGlobalClassFactory(void)

{
  ChClassFactory *this;
  
  if (GetGlobalClassFactory::mfactory == (ChClassFactory *)0x0) {
    this = (ChClassFactory *)::operator_new(0x70);
    ChClassFactory(this);
    GetGlobalClassFactory::mfactory = this;
  }
  return GetGlobalClassFactory::mfactory;
}

Assistant:

ChClassFactory* ChClassFactory::GetGlobalClassFactory() {
    static ChClassFactory* mfactory = 0;
    if (!mfactory)
        mfactory = new ChClassFactory;
    return mfactory;
}